

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsSecondPartialDerivativeWRTStateControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          MatrixDynSize *partialDerivative)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  string *psVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *mat;
  ostringstream errorMsg;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1f0;
  _Rb_tree_node_base *local_1d0;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  local_1a8 [5];
  
  lVar4 = iDynTree::MatrixDynSize::rows();
  lVar5 = iDynTree::VectorDynSize::size();
  if (lVar4 == lVar5) {
    lVar4 = iDynTree::MatrixDynSize::cols();
    lVar5 = iDynTree::VectorDynSize::size();
    if (lVar4 == lVar5) goto LAB_00180760;
  }
  uVar6 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)partialDerivative,uVar6);
LAB_00180760:
  p_Var7 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar1 = true;
  local_1d0 = p_Var10;
  do {
    if (p_Var7 == p_Var10) {
LAB_001809f0:
      return p_Var7 == p_Var10;
    }
    bVar2 = TimeRange::isInRange((TimeRange *)&p_Var7[8]._M_left,time);
    if (bVar2) {
      mat = p_Var7 + 5;
      cVar3 = (**(code **)(**(long **)(p_Var7 + 2) + 0x38))
                        (time,*(long **)(p_Var7 + 2),state,control,mat);
      if (cVar3 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar8 = std::operator<<((ostream *)local_1a8,"Error while evaluating cost ");
        psVar9 = Cost::name_abi_cxx11_(*(Cost **)(p_Var7 + 2));
        poVar8 = std::operator<<(poVar8,(string *)psVar9);
        std::operator<<(poVar8,".");
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","costSecondPartialDerivativeWRTStateControl",
                   (char *)local_1f0.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
      else {
        lVar4 = iDynTree::MatrixDynSize::rows();
        lVar5 = iDynTree::VectorDynSize::size();
        if (lVar4 == lVar5) {
          lVar4 = iDynTree::MatrixDynSize::cols();
          lVar5 = iDynTree::VectorDynSize::size();
          p_Var10 = local_1d0;
          if (lVar4 == lVar5) {
            if (bVar1) {
              toEigen(&local_1f0,(MatrixDynSize *)mat);
              local_1a8[0].m_lhs.m_functor.m_other = (double)p_Var7[8]._M_parent;
              local_1a8[0].m_lhs.m_rows.m_value =
                   local_1f0.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_rows.m_value;
              local_1a8[0].m_lhs.m_cols.m_value =
                   local_1f0.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_cols.m_value;
              local_1a8[0].m_rhs.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value =
                   local_1f0.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_cols.m_value;
              local_1a8[0].m_rhs.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = local_1f0.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
              local_1a8[0].m_rhs.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value =
                   local_1f0.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_rows.m_value;
              toEigen(&local_1c8,partialDerivative);
              Eigen::internal::
              call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>>
                        (&local_1c8,local_1a8);
            }
            else {
              toEigen(&local_1f0,(MatrixDynSize *)mat);
              local_1a8[0].m_lhs.m_functor.m_other = (double)p_Var7[8]._M_parent;
              local_1a8[0].m_lhs.m_rows.m_value =
                   local_1f0.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_rows.m_value;
              local_1a8[0].m_lhs.m_cols.m_value =
                   local_1f0.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_cols.m_value;
              local_1a8[0].m_rhs.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value =
                   local_1f0.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_cols.m_value;
              local_1a8[0].m_rhs.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = local_1f0.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
              local_1a8[0].m_rhs.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value =
                   local_1f0.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_rows.m_value;
              toEigen(&local_1c8,partialDerivative);
              Eigen::
              MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
              operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>
                          *)&local_1c8,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                          *)local_1a8);
            }
            bVar1 = false;
            goto LAB_001808d4;
          }
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar8 = std::operator<<((ostream *)local_1a8,"Error while evaluating ");
        psVar9 = Cost::name_abi_cxx11_(*(Cost **)(p_Var7 + 2));
        poVar8 = std::operator<<(poVar8,(string *)psVar9);
        poVar8 = std::operator<<(poVar8,": ");
        std::operator<<(poVar8,
                        "the hessian size is expected to have as many rows as the state dimension and a number of columns matching the control dimension."
                       );
        std::__cxx11::stringbuf::str();
        p_Var10 = local_1d0;
        iDynTree::reportError
                  ("OptimalControlProblem","costSecondPartialDerivativeWRTStateControl",
                   (char *)local_1f0.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      goto LAB_001809f0;
    }
LAB_001808d4:
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

bool OptimalControlProblem::costsSecondPartialDerivativeWRTStateControl(double time, const VectorDynSize &state, const VectorDynSize &control, MatrixDynSize &partialDerivative)
        {
            if ((partialDerivative.rows() != state.size()) || (partialDerivative.cols() != control.size())) {
                partialDerivative.resize(state.size(), control.size());
            }

            bool first = true;

            for (auto& cost : m_pimpl->costs){
                if (cost.second.timeRange.isInRange(time)){

                    if (!cost.second.cost->costSecondPartialDerivativeWRTStateControl(time, state, control, cost.second.mixedHessianBuffer)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost " << cost.second.cost->name() <<".";
                        reportError("OptimalControlProblem", "costSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                        return false;
                    }

                    if ((cost.second.mixedHessianBuffer.rows() != state.size()) || (cost.second.mixedHessianBuffer.cols() != control.size())){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating " << cost.second.cost->name() <<": " << "the hessian size is expected to have as many rows as the state dimension and a number of columns matching the control dimension.";
                        reportError("OptimalControlProblem", "costSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                        return false;
                    }

                    if (first){
                        toEigen(partialDerivative) = cost.second.weight * toEigen(cost.second.mixedHessianBuffer);
                        first = false;
                    } else {
                        toEigen(partialDerivative) += cost.second.weight * toEigen(cost.second.mixedHessianBuffer);
                    }
                }
            }
            return true;
        }